

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

void __thiscall
kj::ArrayPtr<unsigned_char>::fill(ArrayPtr<unsigned_char> *this,ArrayPtr<const_unsigned_char> other)

{
  uchar *puVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  
  puVar1 = this->ptr;
  sVar2 = this->size_;
  sVar3 = 0;
  for (sVar4 = 0; sVar2 != sVar4; sVar4 = sVar4 + 1) {
    puVar1[sVar4] = other.ptr[sVar3];
    sVar3 = sVar3 + 1;
    if (sVar3 == other.size_) {
      sVar3 = 0;
    }
  }
  return;
}

Assistant:

inline constexpr T* begin() { return ptr; }